

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

char * __thiscall google::anon_unknown_1::FlagValue::TypeName(FlagValue *this)

{
  if ((long)this->type_ < 7) {
    return "bool" + (long)this->type_ * 7;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                ,0x1a2,"const char *google::(anonymous namespace)::FlagValue::TypeName() const");
}

Assistant:

const char* FlagValue::TypeName() const {
  static const char types[] =
      "bool\0xx"
      "int32\0x"
      "uin32\0x"
      "int64\0x"
      "uint64\0"
      "double\0"
      "string";
  if (type_ > FV_MAX_INDEX) {
    assert(false);
    return "";
  }
  // Directly indexing the strings in the 'types' string, each of them is 7 bytes long.
  return &types[type_ * 7];
}